

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ply_reader.cc
# Opt level: O0

Status * __thiscall draco::PlyReader::ParseHeader(PlyReader *this,DecoderBuffer *buffer)

{
  bool bVar1;
  bool *pbVar2;
  Status *pSVar3;
  bool property_parsed;
  StatusOr<bool> _statusor85;
  bool end;
  StatusOr<bool> _statusor78;
  Status *_status;
  DecoderBuffer *in_stack_00000150;
  PlyReader *in_stack_00000158;
  Status *in_stack_ffffffffffffff08;
  Status *in_stack_ffffffffffffff10;
  undefined8 in_stack_ffffffffffffff90;
  PlyReader *in_stack_ffffffffffffff98;
  uint local_5c;
  StatusOr<bool> local_48;
  
  ParseEndHeader(in_stack_ffffffffffffff98,(DecoderBuffer *)in_stack_ffffffffffffff90);
  bVar1 = StatusOr<bool>::ok((StatusOr<bool> *)0x13db72);
  if (bVar1) {
    pbVar2 = StatusOr<bool>::value(&local_48);
    if ((*pbVar2 & 1U) == 0) {
      bVar1 = ParseElement((PlyReader *)_statusor85.status_.error_msg_.field_2._8_8_,
                           (DecoderBuffer *)
                           _statusor85.status_.error_msg_.field_2._M_allocated_capacity);
      if (bVar1) {
        local_5c = 2;
      }
      else {
        ParseProperty(in_stack_00000158,in_stack_00000150);
        bVar1 = StatusOr<bool>::ok((StatusOr<bool> *)0x13dc89);
        if (bVar1) {
          pbVar2 = StatusOr<bool>::value((StatusOr<bool> *)&stack0xffffffffffffff70);
          if ((*pbVar2 & 1U) == 0) {
            parser::SkipLine((DecoderBuffer *)0x13dd47);
            local_5c = 0;
          }
          else {
            local_5c = 2;
          }
        }
        else {
          StatusOr<bool>::status((StatusOr<bool> *)&stack0xffffffffffffff70);
          Status::Status(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
          local_5c = 1;
        }
        StatusOr<bool>::~StatusOr((StatusOr<bool> *)0x13dd5e);
      }
    }
    else {
      local_5c = 3;
    }
  }
  else {
    StatusOr<bool>::status(&local_48);
    Status::Status(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
    local_5c = 1;
  }
  StatusOr<bool>::~StatusOr((StatusOr<bool> *)0x13dd6b);
  pSVar3 = (Status *)(*(code *)(&DAT_002122d0 + *(int *)(&DAT_002122d0 + (ulong)local_5c * 4)))();
  return pSVar3;
}

Assistant:

Status PlyReader::ParseHeader(DecoderBuffer *buffer) {
  while (true) {
    DRACO_ASSIGN_OR_RETURN(bool end, ParseEndHeader(buffer));
    if (end) {
      break;
    }
    if (ParseElement(buffer)) {
      continue;
    }
    DRACO_ASSIGN_OR_RETURN(bool property_parsed, ParseProperty(buffer));
    if (property_parsed) {
      continue;
    }
    parser::SkipLine(buffer);
  }
  return OkStatus();
}